

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O0

dlist_t * dlist_ins_front(dlist_head_t *head,void *data)

{
  int iVar1;
  dlist_t *dlist;
  void *data_local;
  dlist_head_t *head_local;
  
  head_local = (dlist_head_t *)dlist_new(data);
  if ((dlist_t *)head_local == (dlist_t *)0x0) {
    head_local = (dlist_head_t *)0x0;
  }
  else {
    iVar1 = dlist_insl_front(head,(dlist_t *)head_local);
    if (iVar1 == 0) {
      dlist_delete((dlist_t *)head_local,(_func_void_void_ptr *)0x0);
      head_local = (dlist_head_t *)0x0;
    }
  }
  return (dlist_t *)head_local;
}

Assistant:

dlist_t *dlist_ins_front(dlist_head_t *head, void *data) {
   dlist_t *dlist = dlist_new(data);

   if (!dlist)
      return NULL;

   if (dlist_insl_front(head, dlist)) {
      return dlist;
   } else {
      dlist_delete(dlist, NULL);
      return NULL;
   }
}